

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::empty_object_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other)

{
  json_reference_storage jVar1;
  byte bVar2;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar3;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar4;
  half_storage hVar5;
  undefined8 uVar6;
  int64_t iVar7;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar8;
  common_storage cVar9;
  int64_t iVar10;
  void *__src;
  ulong uVar11;
  bool_storage temp;
  undefined1 auStack_3d6 [14];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_3c8;
  undefined1 auStack_396 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_380;
  undefined1 auStack_34e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_338;
  undefined1 auStack_306 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_2f0;
  undefined1 auStack_2be [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_2a8;
  undefined1 auStack_276 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_260;
  undefined1 auStack_22e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_218;
  undefined1 auStack_1ae [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_198;
  undefined1 auStack_166 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_150;
  undefined1 auStack_11e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_108;
  undefined1 auStack_d6 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_c0;
  undefined1 auStack_8e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_78;
  undefined1 auStack_46 [22];
  
  jVar1 = (other->field_0).json_ref_;
  switch((byte)jVar1 & 0xf) {
  case 0:
  case 4:
    cVar9 = (other->field_0).common_;
    (other->field_0).common_ = *(common_storage *)this;
    goto LAB_001e7afb;
  case 1:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).boolean_.val_;
    cVar9 = (other->field_0).common_;
    (other->field_0).common_ = *(common_storage *)this;
    this[2] = bVar8;
LAB_001e7afb:
    *(common_storage *)this = cVar9;
    return;
  default:
    uVar6 = *(undefined8 *)&other->field_0;
    iVar10 = (other->field_0).int64_.val_;
    (other->field_0).common_ = *(common_storage *)this;
    *(undefined8 *)this = uVar6;
    *(int64_t *)(this + 8) = iVar10;
    return;
  case 6:
    hVar5 = (other->field_0).half_float_;
    (other->field_0).common_ = *(common_storage *)this;
    *(half_storage *)this = hVar5;
    return;
  case 7:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    uVar11 = (ulong)((byte)jVar1 >> 4);
    memcpy(auStack_46,(void *)((long)&other->field_0 + 2),uVar11);
    auStack_46[uVar11] = 0;
    (other->field_0).common_ = *(common_storage *)this;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
    this[1] = bVar8;
    memcpy(this + 2,auStack_46,uVar11);
    this[uVar11 + 2] = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
    return;
  case 10:
  case 0xb:
    jVar1 = (other->field_0).json_ref_;
    pbStack_78 = this;
    switch((byte)jVar1 & 0xf) {
    case 0:
    case 4:
      cVar9 = (other->field_0).common_;
      (other->field_0).boolean_.val_ = (bool)this[2];
      (other->field_0).common_ = *(common_storage *)this;
      goto LAB_001e7c76;
    case 1:
      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).boolean_.val_;
      cVar9 = (other->field_0).common_;
      (other->field_0).boolean_.val_ = (bool)this[2];
      (other->field_0).common_ = *(common_storage *)this;
      this[2] = bVar8;
LAB_001e7c76:
      *(common_storage *)this = cVar9;
      return;
    default:
      uVar6 = *(undefined8 *)&other->field_0;
      iVar10 = (other->field_0).int64_.val_;
      (other->field_0).boolean_.val_ = (bool)this[2];
      (other->field_0).common_ = *(common_storage *)this;
      *(undefined8 *)this = uVar6;
      *(int64_t *)(this + 8) = iVar10;
      return;
    case 6:
      hVar5 = (other->field_0).half_float_;
      (other->field_0).boolean_.val_ = (bool)this[2];
      (other->field_0).common_ = *(common_storage *)this;
      *(half_storage *)this = hVar5;
      return;
    case 7:
      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      uVar11 = (ulong)((byte)jVar1 >> 4);
      memcpy(auStack_8e,(void *)((long)&other->field_0 + 2),uVar11);
      auStack_8e[uVar11] = 0;
      (other->field_0).common_ = *(common_storage *)this;
      (other->field_0).boolean_.val_ = (bool)this[2];
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
      this[1] = bVar8;
      memcpy(this + 2,auStack_8e,uVar11);
      this[uVar11 + 2] =
           (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
      return;
    case 10:
    case 0xb:
      jVar1 = (other->field_0).json_ref_;
      pbStack_c0 = this;
      switch((byte)jVar1 & 0xf) {
      case 0:
      case 4:
        cVar9 = (other->field_0).common_;
        iVar10 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar10;
        goto LAB_001e7dbd;
      case 1:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                (other->field_0).boolean_.val_;
        cVar9 = (other->field_0).common_;
        iVar10 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar10;
        this[2] = bVar8;
LAB_001e7dbd:
        *(common_storage *)this = cVar9;
        return;
      default:
        uVar6 = *(undefined8 *)&other->field_0;
        iVar10 = (other->field_0).int64_.val_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        *(undefined8 *)this = uVar6;
        *(int64_t *)(this + 8) = iVar10;
        return;
      case 6:
        hVar5 = (other->field_0).half_float_;
        iVar10 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar10;
        *(half_storage *)this = hVar5;
        return;
      case 7:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        uVar11 = (ulong)((byte)jVar1 >> 4);
        memcpy(auStack_d6,(void *)((long)&other->field_0 + 2),uVar11);
        auStack_d6[uVar11] = 0;
        iVar10 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar10;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
        this[1] = bVar8;
        memcpy(this + 2,auStack_d6,uVar11);
        this[uVar11 + 2] =
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
        return;
      case 10:
      case 0xb:
        jVar1 = (other->field_0).json_ref_;
        pbStack_108 = this;
        switch((byte)jVar1 & 0xf) {
        case 0:
        case 4:
          cVar9 = (other->field_0).common_;
          iVar10 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar10;
          goto LAB_001e7efd;
        case 1:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                  (other->field_0).boolean_.val_;
          cVar9 = (other->field_0).common_;
          iVar10 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar10;
          this[2] = bVar8;
LAB_001e7efd:
          *(common_storage *)this = cVar9;
          return;
        default:
          uVar6 = *(undefined8 *)&other->field_0;
          iVar10 = (other->field_0).int64_.val_;
          iVar7 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar7;
          *(undefined8 *)this = uVar6;
          *(int64_t *)(this + 8) = iVar10;
          return;
        case 6:
          hVar5 = (other->field_0).half_float_;
          iVar10 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar10;
          *(half_storage *)this = hVar5;
          return;
        case 7:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                  (other->field_0).common_.tag_;
          uVar11 = (ulong)((byte)jVar1 >> 4);
          memcpy(auStack_11e,(void *)((long)&other->field_0 + 2),uVar11);
          auStack_11e[uVar11] = 0;
          iVar10 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar10;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
          this[1] = bVar8;
          memcpy(this + 2,auStack_11e,uVar11);
          this[uVar11 + 2] =
               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
          return;
        case 10:
        case 0xb:
          jVar1 = (other->field_0).json_ref_;
          pbStack_150 = this;
          switch((byte)jVar1 & 0xf) {
          case 0:
          case 4:
            cVar9 = (other->field_0).common_;
            (other->field_0).half_float_ = *(half_storage *)this;
            goto LAB_001e802a;
          case 1:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                    (other->field_0).boolean_.val_;
            cVar9 = (other->field_0).common_;
            (other->field_0).half_float_ = *(half_storage *)this;
            this[2] = bVar8;
LAB_001e802a:
            *(common_storage *)this = cVar9;
            return;
          default:
            uVar6 = *(undefined8 *)&other->field_0;
            iVar10 = (other->field_0).int64_.val_;
            (other->field_0).half_float_ = *(half_storage *)this;
            *(undefined8 *)this = uVar6;
            *(int64_t *)(this + 8) = iVar10;
            return;
          case 6:
            hVar5 = (other->field_0).half_float_;
            (other->field_0).half_float_ = *(half_storage *)this;
            *(half_storage *)this = hVar5;
            return;
          case 7:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            uVar11 = (ulong)((byte)jVar1 >> 4);
            memcpy(auStack_166,(void *)((long)&other->field_0 + 2),uVar11);
            auStack_166[uVar11] = 0;
            (other->field_0).half_float_ = *(half_storage *)this;
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
            this[1] = bVar8;
            memcpy(this + 2,auStack_166,uVar11);
            this[uVar11 + 2] =
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
            return;
          case 10:
          case 0xb:
            jVar1 = (other->field_0).json_ref_;
            pbStack_198 = this;
            switch((byte)jVar1 & 0xf) {
            case 0:
            case 4:
              cVar9 = (other->field_0).common_;
              iVar10 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar10;
              goto LAB_001e8167;
            case 1:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                      (other->field_0).boolean_.val_;
              cVar9 = (other->field_0).common_;
              iVar10 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar10;
              this[2] = bVar8;
LAB_001e8167:
              *(common_storage *)this = cVar9;
              return;
            default:
              uVar6 = *(undefined8 *)&other->field_0;
              iVar10 = (other->field_0).int64_.val_;
              iVar7 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar7;
              *(undefined8 *)this = uVar6;
              *(int64_t *)(this + 8) = iVar10;
              return;
            case 6:
              hVar5 = (other->field_0).half_float_;
              iVar10 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar10;
              *(half_storage *)this = hVar5;
              return;
            case 7:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              uVar11 = (ulong)((byte)jVar1 >> 4);
              memcpy(auStack_1ae,(void *)((long)&other->field_0 + 2),uVar11);
              auStack_1ae[uVar11] = 0;
              iVar10 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar10;
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1
              ;
              this[1] = bVar8;
              memcpy(this + 2,auStack_1ae,uVar11);
              this[uVar11 + 2] =
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
              return;
            case 10:
            case 0xb:
              bVar2 = *(byte *)&other->field_0;
              switch(bVar2 & 0xf) {
              case 0:
              case 4:
                cVar9 = (other->field_0).common_;
                bVar8 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)(cVar9._0_1_ & 0xf0 | (byte)bVar8 & 0xf);
                bVar3 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)((byte)bVar3 & 0xf0 | (byte)bVar8 & 0xf);
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
                *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
                *(common_storage *)this = cVar9;
                break;
              case 1:
                bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                        (other->field_0).boolean_.val_;
                cVar9 = (other->field_0).common_;
                bVar3 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)(bVar2 & 0xf0 | (byte)bVar3 & 0xf);
                bVar4 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)((byte)bVar4 & 0xf0 | (byte)bVar3 & 0xf);
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
                *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) = 0;
                *(common_storage *)this = cVar9;
                this[2] = bVar8;
                break;
              default:
                uVar6 = *(undefined8 *)&other->field_0;
                iVar10 = (other->field_0).int64_.val_;
                bVar8 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)(bVar2 & 0xf0 | (byte)bVar8 & 0xf);
                bVar3 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)((byte)bVar3 & 0xf0 | (byte)bVar8 & 0xf);
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
                *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
                *(undefined8 *)this = uVar6;
                *(int64_t *)(this + 8) = iVar10;
                break;
              case 6:
                hVar5 = (other->field_0).half_float_;
                bVar8 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)(hVar5._0_1_ & 0xf0 | (byte)bVar8 & 0xf);
                bVar3 = *this;
                (other->field_0).json_ref_ =
                     (json_reference_storage)((byte)bVar3 & 0xf0 | (byte)bVar8 & 0xf);
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
                *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
                *(half_storage *)this = hVar5;
                break;
              case 7:
                swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
                          (this,other);
                return;
              case 10:
              case 0xb:
                jVar1 = (other->field_0).json_ref_;
                pbStack_218 = this;
                switch((byte)jVar1 & 0xf) {
                case 0:
                case 4:
                  cVar9 = (other->field_0).common_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  goto LAB_001e84ee;
                case 1:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          (other->field_0).boolean_.val_;
                  cVar9 = (other->field_0).common_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  this[2] = bVar8;
LAB_001e84ee:
                  *(common_storage *)this = cVar9;
                  return;
                default:
                  uVar6 = *(undefined8 *)&other->field_0;
                  iVar10 = (other->field_0).int64_.val_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *(undefined8 *)this = uVar6;
                  *(int64_t *)(this + 8) = iVar10;
                  return;
                case 6:
                  hVar5 = (other->field_0).half_float_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *(half_storage *)this = hVar5;
                  return;
                case 7:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  uVar11 = (ulong)((byte)jVar1 >> 4);
                  memcpy(auStack_22e,(void *)((long)&other->field_0 + 2),uVar11);
                  auStack_22e[uVar11] = 0;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          jVar1;
                  this[1] = bVar8;
                  memcpy(this + 2,auStack_22e,uVar11);
                  this[uVar11 + 2] =
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
                  return;
                case 10:
                case 0xb:
                  jVar1 = (other->field_0).json_ref_;
                  pbStack_260 = this;
                  switch((byte)jVar1 & 0xf) {
                  case 0:
                  case 4:
                    cVar9 = (other->field_0).common_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    goto LAB_001e86bc;
                  case 1:
                    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )(other->field_0).boolean_.val_;
                    cVar9 = (other->field_0).common_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    this[2] = bVar8;
LAB_001e86bc:
                    *(common_storage *)this = cVar9;
                    return;
                  default:
                    uVar6 = *(undefined8 *)&other->field_0;
                    iVar10 = (other->field_0).int64_.val_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    *(undefined8 *)this = uVar6;
                    *(int64_t *)(this + 8) = iVar10;
                    return;
                  case 6:
                    hVar5 = (other->field_0).half_float_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    *(half_storage *)this = hVar5;
                    return;
                  case 7:
                    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )(other->field_0).common_.tag_;
                    uVar11 = (ulong)((byte)jVar1 >> 4);
                    memcpy(auStack_276,(void *)((long)&other->field_0 + 2),uVar11);
                    auStack_276[uVar11] = 0;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )jVar1;
                    this[1] = bVar8;
                    memcpy(this + 2,auStack_276,uVar11);
                    this[uVar11 + 2] =
                         (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                         0x0;
                    return;
                  case 10:
                  case 0xb:
                    jVar1 = (other->field_0).json_ref_;
                    pbStack_2a8 = this;
                    switch((byte)jVar1 & 0xf) {
                    case 0:
                    case 4:
                      cVar9 = (other->field_0).common_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      goto LAB_001e888e;
                    case 1:
                      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )(other->field_0).boolean_.val_;
                      cVar9 = (other->field_0).common_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      this[2] = bVar8;
LAB_001e888e:
                      *(common_storage *)this = cVar9;
                      return;
                    default:
                      uVar6 = *(undefined8 *)&other->field_0;
                      iVar10 = (other->field_0).int64_.val_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      *(undefined8 *)this = uVar6;
                      *(int64_t *)(this + 8) = iVar10;
                      return;
                    case 6:
                      hVar5 = (other->field_0).half_float_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      *(half_storage *)this = hVar5;
                      return;
                    case 7:
                      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )(other->field_0).common_.tag_;
                      uVar11 = (ulong)((byte)jVar1 >> 4);
                      memcpy(auStack_2be,(void *)((long)&other->field_0 + 2),uVar11);
                      auStack_2be[uVar11] = 0;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )jVar1;
                      this[1] = bVar8;
                      memcpy(this + 2,auStack_2be,uVar11);
                      this[uVar11 + 2] =
                           (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                           0x0;
                      return;
                    case 10:
                    case 0xb:
                      jVar1 = (other->field_0).json_ref_;
                      pbStack_2f0 = this;
                      switch((byte)jVar1 & 0xf) {
                      case 0:
                      case 4:
                        cVar9 = (other->field_0).common_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        goto LAB_001e8a60;
                      case 1:
                        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )(other->field_0).boolean_.val_;
                        cVar9 = (other->field_0).common_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        this[2] = bVar8;
LAB_001e8a60:
                        *(common_storage *)this = cVar9;
                        return;
                      default:
                        uVar6 = *(undefined8 *)&other->field_0;
                        iVar10 = (other->field_0).int64_.val_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        *(undefined8 *)this = uVar6;
                        *(int64_t *)(this + 8) = iVar10;
                        return;
                      case 6:
                        hVar5 = (other->field_0).half_float_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        *(half_storage *)this = hVar5;
                        return;
                      case 7:
                        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )(other->field_0).common_.tag_;
                        uVar11 = (ulong)((byte)jVar1 >> 4);
                        memcpy(auStack_306,(void *)((long)&other->field_0 + 2),uVar11);
                        auStack_306[uVar11] = 0;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )jVar1;
                        this[1] = bVar8;
                        memcpy(this + 2,auStack_306,uVar11);
                        this[uVar11 + 2] =
                             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                              )0x0;
                        return;
                      case 10:
                      case 0xb:
                        jVar1 = (other->field_0).json_ref_;
                        pbStack_338 = this;
                        switch((byte)jVar1 & 0xf) {
                        case 0:
                        case 4:
                          cVar9 = (other->field_0).common_;
                          iVar10 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar10;
                          goto LAB_001e8baf;
                        case 1:
                          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )(other->field_0).boolean_.val_;
                          cVar9 = (other->field_0).common_;
                          iVar10 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar10;
                          this[2] = bVar8;
LAB_001e8baf:
                          *(common_storage *)this = cVar9;
                          return;
                        default:
                          uVar6 = *(undefined8 *)&other->field_0;
                          iVar10 = (other->field_0).int64_.val_;
                          iVar7 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar7;
                          *(undefined8 *)this = uVar6;
                          *(int64_t *)(this + 8) = iVar10;
                          return;
                        case 6:
                          hVar5 = (other->field_0).half_float_;
                          iVar10 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar10;
                          *(half_storage *)this = hVar5;
                          return;
                        case 7:
                          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )(other->field_0).common_.tag_;
                          uVar11 = (ulong)((byte)jVar1 >> 4);
                          memcpy(auStack_34e,(void *)((long)&other->field_0 + 2),uVar11);
                          auStack_34e[uVar11] = 0;
                          iVar10 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar10;
                          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )jVar1;
                          this[1] = bVar8;
                          memcpy(this + 2,auStack_34e,uVar11);
                          this[uVar11 + 2] =
                               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                )0x0;
                          return;
                        case 10:
                        case 0xb:
                          jVar1 = (other->field_0).json_ref_;
                          pbStack_380 = this;
                          switch((byte)jVar1 & 0xf) {
                          case 0:
                          case 4:
                            cVar9 = (other->field_0).common_;
                            iVar10 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar10;
                            goto LAB_001e8cef;
                          case 1:
                            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )(other->field_0).boolean_.val_;
                            cVar9 = (other->field_0).common_;
                            iVar10 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar10;
                            this[2] = bVar8;
LAB_001e8cef:
                            *(common_storage *)this = cVar9;
                            return;
                          default:
                            uVar6 = *(undefined8 *)&other->field_0;
                            iVar10 = (other->field_0).int64_.val_;
                            iVar7 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar7;
                            *(undefined8 *)this = uVar6;
                            *(int64_t *)(this + 8) = iVar10;
                            return;
                          case 6:
                            hVar5 = (other->field_0).half_float_;
                            iVar10 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar10;
                            *(half_storage *)this = hVar5;
                            return;
                          case 7:
                            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )(other->field_0).common_.tag_;
                            uVar11 = (ulong)((byte)jVar1 >> 4);
                            memcpy(auStack_396,(void *)((long)&other->field_0 + 2),uVar11);
                            auStack_396[uVar11] = 0;
                            iVar10 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar10;
                            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )jVar1;
                            this[1] = bVar8;
                            memcpy(this + 2,auStack_396,uVar11);
                            this[uVar11 + 2] =
                                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                  )0x0;
                            return;
                          case 10:
                          case 0xb:
                            jVar1 = (other->field_0).json_ref_;
                            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )(other->field_0).common_.tag_;
                            __src = (void *)((long)&other->field_0 + 2);
                            uVar11 = (ulong)((byte)jVar1 >> 4);
                            pbStack_3c8 = this;
                            memcpy(auStack_3d6,__src,uVar11);
                            auStack_3d6[uVar11] = 0;
                            bVar3 = *this;
                            (other->field_0).json_ref_ =
                                 (json_reference_storage)((byte)jVar1 & 0xf0 | (byte)bVar3 & 0xf);
                            bVar4 = *this;
                            (other->field_0).json_ref_ =
                                 (json_reference_storage)((byte)bVar4 & 0xf0 | (byte)bVar3 & 0xf);
                            (other->field_0).common_.tag_ = (semantic_tag)this[1];
                            memcpy(__src,this + 2,(ulong)((byte)*this >> 4));
                            *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) =
                                 0;
                            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )jVar1;
                            this[1] = bVar8;
                            memcpy(this + 2,auStack_3d6,uVar11);
                            this[uVar11 + 2] =
                                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                  )0x0;
                            return;
                          case 0xc:
                            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )(other->field_0).common_.tag_;
                            iVar10 = (other->field_0).int64_.val_;
                            iVar7 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar7;
                            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )0xc;
                            break;
                          case 0xd:
                            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )(other->field_0).common_.tag_;
                            iVar10 = (other->field_0).int64_.val_;
                            iVar7 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar7;
                            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )0xd;
                            break;
                          case 0xe:
                            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )(other->field_0).common_.tag_;
                            iVar10 = (other->field_0).int64_.val_;
                            iVar7 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar7;
                            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )0xe;
                            break;
                          case 0xf:
                            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )(other->field_0).common_.tag_;
                            iVar10 = (other->field_0).int64_.val_;
                            iVar7 = *(int64_t *)(this + 8);
                            *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                            (other->field_0).int64_.val_ = iVar7;
                            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                     )0xf;
                          }
                          this[1] = bVar8;
                          *(int64_t *)(this + 8) = iVar10;
                          return;
                        case 0xc:
                          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )(other->field_0).common_.tag_;
                          iVar10 = (other->field_0).int64_.val_;
                          iVar7 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar7;
                          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )0xc;
                          break;
                        case 0xd:
                          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )(other->field_0).common_.tag_;
                          iVar10 = (other->field_0).int64_.val_;
                          iVar7 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar7;
                          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )0xd;
                          break;
                        case 0xe:
                          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )(other->field_0).common_.tag_;
                          iVar10 = (other->field_0).int64_.val_;
                          iVar7 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar7;
                          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )0xe;
                          break;
                        case 0xf:
                          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )(other->field_0).common_.tag_;
                          iVar10 = (other->field_0).int64_.val_;
                          iVar7 = *(int64_t *)(this + 8);
                          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                          (other->field_0).int64_.val_ = iVar7;
                          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                   )0xf;
                        }
                        this[1] = bVar8;
                        *(int64_t *)(this + 8) = iVar10;
                        return;
                      case 0xc:
                        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )(other->field_0).common_.tag_;
                        iVar10 = (other->field_0).int64_.val_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )0xc;
                        break;
                      case 0xd:
                        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )(other->field_0).common_.tag_;
                        iVar10 = (other->field_0).int64_.val_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )0xd;
                        break;
                      case 0xe:
                        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )(other->field_0).common_.tag_;
                        iVar10 = (other->field_0).int64_.val_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )0xe;
                        break;
                      case 0xf:
                        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )(other->field_0).common_.tag_;
                        iVar10 = (other->field_0).int64_.val_;
                        (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                        (other->field_0).common_.tag_ = (semantic_tag)this[1];
                        (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                 )0xf;
                      }
                      this[1] = bVar8;
                      *(int64_t *)(this + 8) = iVar10;
                      return;
                    case 0xc:
                      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )(other->field_0).common_.tag_;
                      iVar10 = (other->field_0).int64_.val_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )0xc;
                      break;
                    case 0xd:
                      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )(other->field_0).common_.tag_;
                      iVar10 = (other->field_0).int64_.val_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )0xd;
                      break;
                    case 0xe:
                      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )(other->field_0).common_.tag_;
                      iVar10 = (other->field_0).int64_.val_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )0xe;
                      break;
                    case 0xf:
                      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )(other->field_0).common_.tag_;
                      iVar10 = (other->field_0).int64_.val_;
                      (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               )0xf;
                    }
                    this[1] = bVar8;
                    *(int64_t *)(this + 8) = iVar10;
                    return;
                  case 0xc:
                    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )(other->field_0).common_.tag_;
                    iVar10 = (other->field_0).int64_.val_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )0xc;
                    break;
                  case 0xd:
                    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )(other->field_0).common_.tag_;
                    iVar10 = (other->field_0).int64_.val_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )0xd;
                    break;
                  case 0xe:
                    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )(other->field_0).common_.tag_;
                    iVar10 = (other->field_0).int64_.val_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )0xe;
                    break;
                  case 0xf:
                    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )(other->field_0).common_.tag_;
                    iVar10 = (other->field_0).int64_.val_;
                    (other->field_0).json_ref_ = (json_reference_storage)((byte)*this & 0xf);
                    (other->field_0).common_.tag_ = (semantic_tag)this[1];
                    (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            )0xf;
                  }
                  this[1] = bVar8;
                  *(int64_t *)(this + 8) = iVar10;
                  return;
                case 0xc:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  iVar10 = (other->field_0).int64_.val_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          0xc;
                  break;
                case 0xd:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  iVar10 = (other->field_0).int64_.val_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          0xd;
                  break;
                case 0xe:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  iVar10 = (other->field_0).int64_.val_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          0xe;
                  break;
                case 0xf:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  iVar10 = (other->field_0).int64_.val_;
                  (other->field_0).json_ref_ = (json_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                          0xf;
                }
                this[1] = bVar8;
                *(int64_t *)(this + 8) = iVar10;
                return;
              case 0xc:
                swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
                          (this,other);
                return;
              case 0xd:
                swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                          (this,other);
                return;
              case 0xe:
                swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::array_storage>
                          (this,other);
                return;
              case 0xf:
                swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
                          (this,other);
                return;
              }
              return;
            case 0xc:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              iVar10 = (other->field_0).int64_.val_;
              iVar7 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar7;
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
              break;
            case 0xd:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              iVar10 = (other->field_0).int64_.val_;
              iVar7 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar7;
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
              break;
            case 0xe:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              iVar10 = (other->field_0).int64_.val_;
              iVar7 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar7;
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
              break;
            case 0xf:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              iVar10 = (other->field_0).int64_.val_;
              iVar7 = *(int64_t *)(this + 8);
              *(undefined8 *)&other->field_0 = *(undefined8 *)this;
              (other->field_0).int64_.val_ = iVar7;
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
            }
            this[1] = bVar8;
            *(int64_t *)(this + 8) = iVar10;
            return;
          case 0xc:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            iVar10 = (other->field_0).int64_.val_;
            (other->field_0).half_float_ = *(half_storage *)this;
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
            break;
          case 0xd:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            iVar10 = (other->field_0).int64_.val_;
            (other->field_0).half_float_ = *(half_storage *)this;
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
            break;
          case 0xe:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            iVar10 = (other->field_0).int64_.val_;
            (other->field_0).half_float_ = *(half_storage *)this;
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
            break;
          case 0xf:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            iVar10 = (other->field_0).int64_.val_;
            (other->field_0).half_float_ = *(half_storage *)this;
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
          }
          this[1] = bVar8;
          *(int64_t *)(this + 8) = iVar10;
          return;
        case 0xc:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                  (other->field_0).common_.tag_;
          iVar10 = (other->field_0).int64_.val_;
          iVar7 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar7;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
          break;
        case 0xd:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                  (other->field_0).common_.tag_;
          iVar10 = (other->field_0).int64_.val_;
          iVar7 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar7;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
          break;
        case 0xe:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                  (other->field_0).common_.tag_;
          iVar10 = (other->field_0).int64_.val_;
          iVar7 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar7;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
          break;
        case 0xf:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                  (other->field_0).common_.tag_;
          iVar10 = (other->field_0).int64_.val_;
          iVar7 = *(int64_t *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).int64_.val_ = iVar7;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
        }
        this[1] = bVar8;
        *(int64_t *)(this + 8) = iVar10;
        return;
      case 0xc:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        iVar10 = (other->field_0).int64_.val_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
        break;
      case 0xd:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        iVar10 = (other->field_0).int64_.val_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
        break;
      case 0xe:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        iVar10 = (other->field_0).int64_.val_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
        break;
      case 0xf:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        iVar10 = (other->field_0).int64_.val_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
      }
      this[1] = bVar8;
      *(int64_t *)(this + 8) = iVar10;
      return;
    case 0xc:
      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar10 = (other->field_0).int64_.val_;
      (other->field_0).common_ = *(common_storage *)this;
      (other->field_0).boolean_.val_ = (bool)this[2];
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
      break;
    case 0xd:
      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar10 = (other->field_0).int64_.val_;
      (other->field_0).common_ = *(common_storage *)this;
      (other->field_0).boolean_.val_ = (bool)this[2];
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
      break;
    case 0xe:
      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar10 = (other->field_0).int64_.val_;
      (other->field_0).common_ = *(common_storage *)this;
      (other->field_0).boolean_.val_ = (bool)this[2];
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
      break;
    case 0xf:
      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar10 = (other->field_0).int64_.val_;
      (other->field_0).common_ = *(common_storage *)this;
      (other->field_0).boolean_.val_ = (bool)this[2];
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
    }
    this[1] = bVar8;
    *(int64_t *)(this + 8) = iVar10;
    return;
  case 0xc:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar10 = (other->field_0).int64_.val_;
    (other->field_0).common_ = *(common_storage *)this;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
    break;
  case 0xd:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar10 = (other->field_0).int64_.val_;
    (other->field_0).common_ = *(common_storage *)this;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
    break;
  case 0xe:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar10 = (other->field_0).int64_.val_;
    (other->field_0).common_ = *(common_storage *)this;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
    break;
  case 0xf:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar10 = (other->field_0).int64_.val_;
    (other->field_0).common_ = *(common_storage *)this;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
  }
  this[1] = bVar8;
  *(int64_t *)(this + 8) = iVar10;
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }